

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosComm.cpp
# Opt level: O3

Comm __thiscall
adios2::helper::CommImpl::MakeComm
          (CommImpl *this,
          unique_ptr<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_> *impl
          )

{
  _Head_base<0UL,_adios2::helper::CommImpl_*,_false> local_10;
  
  local_10._M_head_impl =
       (impl->_M_t).
       super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
       ._M_t.
       super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
       .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl;
  (impl->_M_t).
  super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>.
  _M_t.
  super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
  .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl = (CommImpl *)0x0;
  Comm::Comm((Comm *)this,
             (unique_ptr<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_> *
             )&local_10);
  if (local_10._M_head_impl != (CommImpl *)0x0) {
    (*(local_10._M_head_impl)->_vptr_CommImpl[1])();
  }
  return (unique_ptr<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>)
         (unique_ptr<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>)this;
}

Assistant:

Comm CommImpl::MakeComm(std::unique_ptr<CommImpl> impl) { return Comm(std::move(impl)); }